

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int io_type(lua_State *L)

{
  StkId pTVar1;
  int iVar2;
  long *plVar3;
  char *s;
  size_t sStack_20;
  
  luaL_checkany(L,1);
  plVar3 = (long *)lua_touserdata(L,1);
  iVar2 = -10000;
  lua_getfield(L,-10000,"FILE*");
  if (((plVar3 != (long *)0x0) && (iVar2 = lua_getmetatable(L,iVar2), iVar2 != 0)) &&
     (iVar2 = lua_rawequal(L,-2,-1), iVar2 != 0)) {
    if (*plVar3 == 0) {
      s = "closed file";
      sStack_20 = 0xb;
    }
    else {
      s = "file";
      sStack_20 = 4;
    }
    lua_pushlstring(L,s,sStack_20);
    return 1;
  }
  pTVar1 = L->top;
  pTVar1->tt = 0;
  L->top = pTVar1 + 1;
  return 1;
}

Assistant:

static int io_type(lua_State*L){
void*ud;
luaL_checkany(L,1);
ud=lua_touserdata(L,1);
lua_getfield(L,(-10000),"FILE*");
if(ud==NULL||!lua_getmetatable(L,1)||!lua_rawequal(L,-2,-1))
lua_pushnil(L);
else if(*((FILE**)ud)==NULL)
lua_pushliteral(L,"closed file");
else
lua_pushliteral(L,"file");
return 1;
}